

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

BrotliDecoderErrorCode
CopyUncompressedBlockToOutput
          (size_t *available_out,uint8_t **next_out,size_t *total_out,BrotliDecoderStateInternal *s)

{
  size_t *psVar1;
  uint8_t **ppuVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  BrotliDecoderErrorCode BVar6;
  BrotliRunningUncompressedState BVar7;
  uint32_t uVar8;
  uint8_t *__dest;
  size_t __n;
  
  iVar4 = BrotliEnsureRingBuffer(s);
  if (iVar4 == 0) {
    return BROTLI_DECODER_ERROR_ALLOC_RING_BUFFER_1;
  }
  BVar7 = s->substate_uncompressed;
LAB_0010382a:
  if (BVar7 != BROTLI_STATE_UNCOMPRESSED_WRITE) goto code_r0x00103833;
  goto LAB_001038fe;
code_r0x00103833:
  if (BVar7 == BROTLI_STATE_UNCOMPRESSED_NONE) {
    uVar8 = (s->br).bit_pos_;
    iVar4 = (0x40 - uVar8 >> 3) + (int)(s->br).avail_in;
    if (s->meta_block_remaining_len < iVar4) {
      iVar4 = s->meta_block_remaining_len;
    }
    iVar5 = s->pos;
    iVar3 = s->ringbuffer_size - iVar5;
    if (iVar4 + iVar5 <= s->ringbuffer_size) {
      iVar3 = iVar4;
    }
    __dest = s->ringbuffer + iVar5;
    __n = (long)iVar3;
    while( true ) {
      if ((0xfffffff7 < uVar8 - 0x41) || (__n == 0)) break;
      *__dest = (uint8_t)((s->br).val_ >> ((byte)uVar8 & 0x3f));
      uVar8 = (s->br).bit_pos_ + 8;
      (s->br).bit_pos_ = uVar8;
      __dest = __dest + 1;
      __n = __n - 1;
    }
    memcpy(__dest,(s->br).next_in,__n);
    psVar1 = &(s->br).avail_in;
    *psVar1 = *psVar1 - __n;
    ppuVar2 = &(s->br).next_in;
    *ppuVar2 = *ppuVar2 + __n;
    iVar5 = s->pos + iVar3;
    s->pos = iVar5;
    iVar4 = s->meta_block_remaining_len;
    s->meta_block_remaining_len = iVar4 - iVar3;
    if (iVar5 < 1 << ((byte)s->window_bits & 0x1f)) {
      return (uint)(iVar4 != iVar3) + BROTLI_DECODER_SUCCESS;
    }
    s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_WRITE;
LAB_001038fe:
    BVar6 = WriteRingBuffer(s,available_out,next_out,total_out,0);
    if (BVar6 != BROTLI_DECODER_SUCCESS) {
      return BVar6;
    }
    if (s->ringbuffer_size == 1 << ((byte)s->window_bits & 0x1f)) {
      s->max_distance = s->max_backward_distance;
    }
    s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_NONE;
    BVar7 = BROTLI_STATE_UNCOMPRESSED_NONE;
  }
  goto LAB_0010382a;
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE CopyUncompressedBlockToOutput(
    size_t* available_out, uint8_t** next_out, size_t* total_out,
    BrotliDecoderState* s) {
  /* TODO: avoid allocation for single uncompressed block. */
  if (!BrotliEnsureRingBuffer(s)) {
    return BROTLI_FAILURE(BROTLI_DECODER_ERROR_ALLOC_RING_BUFFER_1);
  }

  /* State machine */
  for (;;) {
    switch (s->substate_uncompressed) {
      case BROTLI_STATE_UNCOMPRESSED_NONE: {
        int nbytes = (int)BrotliGetRemainingBytes(&s->br);
        if (nbytes > s->meta_block_remaining_len) {
          nbytes = s->meta_block_remaining_len;
        }
        if (s->pos + nbytes > s->ringbuffer_size) {
          nbytes = s->ringbuffer_size - s->pos;
        }
        /* Copy remaining bytes from s->br.buf_ to ring-buffer. */
        BrotliCopyBytes(&s->ringbuffer[s->pos], &s->br, (size_t)nbytes);
        s->pos += nbytes;
        s->meta_block_remaining_len -= nbytes;
        if (s->pos < 1 << s->window_bits) {
          if (s->meta_block_remaining_len == 0) {
            return BROTLI_DECODER_SUCCESS;
          }
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_WRITE;
      }
      /* Fall through. */

      case BROTLI_STATE_UNCOMPRESSED_WRITE: {
        BrotliDecoderErrorCode result;
        result = WriteRingBuffer(
            s, available_out, next_out, total_out, BROTLI_FALSE);
        if (result != BROTLI_DECODER_SUCCESS) {
          return result;
        }
        if (s->ringbuffer_size == 1 << s->window_bits) {
          s->max_distance = s->max_backward_distance;
        }
        s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_NONE;
        break;
      }
    }
  }
  BROTLI_DCHECK(0);  /* Unreachable */
}